

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

void __thiscall tonk::gateway::StateMachine::OnTick(StateMachine *this)

{
  pointer pGVar1;
  HTTPRequester *this_00;
  bool bVar2;
  uint uVar3;
  uint64_t nowUsec;
  ulong uVar4;
  long lVar5;
  __shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  API_CopyRequests(this);
  SSDPRequester::OnTick(this->SSDP);
  if ((this->GatewayEndpoints).
      super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->GatewayEndpoints).
      super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    nowUsec = siamese::GetTimeUsec();
    lVar5 = 0xb0;
    uVar3 = (uint)(((long)(this->GatewayEndpoints).
                          super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->GatewayEndpoints).
                         super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 200);
    for (uVar4 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar4; uVar4 = uVar4 + 1) {
      pGVar1 = (this->GatewayEndpoints).
               super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = *(HTTPRequester **)((long)&(pGVar1->URL).FullURL._M_dataplus + lVar5);
      if (this_00 == (HTTPRequester *)0x0) {
LAB_0015e9ab:
        if (0 < *(int *)((long)pGVar1 + lVar5 + -8)) {
          BeginGatewayXMLRequest(this,(int)uVar4);
        }
      }
      else {
        bVar2 = HTTPRequester::OnTick_IsDisposable(this_00,nowUsec);
        if (bVar2) {
          local_48._M_ptr = (element_type *)0x0;
          local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::__shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(pGVar1->URL).FullURL._M_dataplus + lVar5),&local_48);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
          goto LAB_0015e9ab;
        }
      }
      lVar5 = lVar5 + 200;
    }
    lVar5 = 0x120;
    uVar3 = (uint)(((long)(this->ControlEndpoints).
                          super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->ControlEndpoints).
                         super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x128);
    for (uVar4 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar4; uVar4 = uVar4 + 1) {
      if (*(char *)((long)&(((this->ControlEndpoints).
                             super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                             ._M_impl.super__Vector_impl_data._M_start)->URL).FullURL._M_dataplus +
                   lVar5) == '\x01') {
        BeginControlSOAPRequests(this,(int)uVar4);
      }
      lVar5 = lVar5 + 0x128;
    }
  }
  return;
}

Assistant:

void StateMachine::OnTick()
{
    API_CopyRequests();

    SSDP->OnTick();

    if (GatewayEndpoints.empty()) {
        return;
    }

    const uint64_t nowUsec = siamese::GetTimeUsec();

    const int gatewayCount = (int)GatewayEndpoints.size();
    for (int gatewayIndex = 0; gatewayIndex < gatewayCount; ++gatewayIndex)
    {
        auto& gateway = GatewayEndpoints[gatewayIndex];

        // If request is in progress:
        if (gateway.Requester)
        {
            // If the requester is dead:
            if (gateway.Requester->OnTick_IsDisposable(nowUsec)) {
                // Free it so we can try again
                gateway.Requester = nullptr;
            }
            else {
                continue;
            }
        }

        // If there are no more retries:
        if (gateway.RetriesRemaining <= 0) {
            continue; // Do not retry
        }

        BeginGatewayXMLRequest(gatewayIndex);
    }

    // Begin control SOAP requests for each endpoint
    const int controlCount = (int)ControlEndpoints.size();
    for (int controlIndex = 0; controlIndex < controlCount; ++controlIndex)
    {
        ControlEndpoint& control = ControlEndpoints[controlIndex];

        // If endpoint is not active:
        if (!control.EndpointActive) {
            continue;
        }

        BeginControlSOAPRequests(controlIndex);
    }
}